

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_sel_s(DisasContext_conflict6 *ctx,fopcode op1,int fd,int ft,int fs)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 c2;
  TCGv_i32 t;
  TCGv_i32 t_00;
  TCGv_i32 t_01;
  TCGv_i32 fp2;
  TCGv_i32 fp1;
  TCGv_i32 fp0;
  TCGv_i32 t1;
  TCGContext_conflict6 *tcg_ctx;
  int fs_local;
  int ft_local;
  int fd_local;
  fopcode op1_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  c2 = tcg_const_i32_mips64el(tcg_ctx_00,0);
  t = tcg_temp_new_i32(tcg_ctx_00);
  t_00 = tcg_temp_new_i32(tcg_ctx_00);
  t_01 = tcg_temp_new_i32(tcg_ctx_00);
  gen_load_fpr32(ctx,t,fd);
  gen_load_fpr32(ctx,t_00,ft);
  gen_load_fpr32(ctx,t_01,fs);
  if (op1 == OPC_SEL_S) {
    tcg_gen_andi_i32_mips64el(tcg_ctx_00,t,t,1);
    tcg_gen_movcond_i32_mips64el(tcg_ctx_00,TCG_COND_NE,t,t,c2,t_00,t_01);
  }
  else if (op1 == OPC_SELEQZ_S) {
    tcg_gen_andi_i32_mips64el(tcg_ctx_00,t_00,t_00,1);
    tcg_gen_movcond_i32_mips64el(tcg_ctx_00,TCG_COND_EQ,t,t_00,c2,t_01,c2);
  }
  else if (op1 == OPC_SELNEZ_S) {
    tcg_gen_andi_i32_mips64el(tcg_ctx_00,t_00,t_00,1);
    tcg_gen_movcond_i32_mips64el(tcg_ctx_00,TCG_COND_NE,t,t_00,c2,t_01,c2);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  gen_store_fpr32(ctx,t,fd);
  tcg_temp_free_i32(tcg_ctx_00,t_01);
  tcg_temp_free_i32(tcg_ctx_00,t_00);
  tcg_temp_free_i32(tcg_ctx_00,t);
  tcg_temp_free_i32(tcg_ctx_00,c2);
  return;
}

Assistant:

static void gen_sel_s(DisasContext *ctx, enum fopcode op1, int fd, int ft,
                      int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t1 = tcg_const_i32(tcg_ctx, 0);
    TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 fp1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 fp2 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx, fp0, fd);
    gen_load_fpr32(ctx, fp1, ft);
    gen_load_fpr32(ctx, fp2, fs);

    switch (op1) {
    case OPC_SEL_S:
        tcg_gen_andi_i32(tcg_ctx, fp0, fp0, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, fp0, fp0, t1, fp1, fp2);
        break;
    case OPC_SELEQZ_S:
        tcg_gen_andi_i32(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, fp0, fp1, t1, fp2, t1);
        break;
    case OPC_SELNEZ_S:
        tcg_gen_andi_i32(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, fp0, fp1, t1, fp2, t1);
        break;
    default:
        MIPS_INVAL("gen_sel_s");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    gen_store_fpr32(ctx, fp0, fd);
    tcg_temp_free_i32(tcg_ctx, fp2);
    tcg_temp_free_i32(tcg_ctx, fp1);
    tcg_temp_free_i32(tcg_ctx, fp0);
    tcg_temp_free_i32(tcg_ctx, t1);
}